

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void skip_spaces(FT_Byte **acur,FT_Byte *limit)

{
  FT_Byte *local_20;
  FT_Byte *cur;
  FT_Byte *limit_local;
  FT_Byte **acur_local;
  
  cur = limit;
  limit_local = (FT_Byte *)acur;
  for (local_20 = *acur; local_20 < cur; local_20 = local_20 + 1) {
    if ((((*local_20 != ' ') && (*local_20 != '\r')) && (*local_20 != '\n')) &&
       (((*local_20 != '\t' && (*local_20 != '\f')) && (*local_20 != '\0')))) {
      if (*local_20 != '%') break;
      skip_comment(&local_20,cur);
    }
  }
  *(FT_Byte **)limit_local = local_20;
  return;
}

Assistant:

static void
  skip_spaces( FT_Byte*  *acur,
               FT_Byte*   limit )
  {
    FT_Byte*  cur = *acur;


    while ( cur < limit )
    {
      if ( !IS_PS_SPACE( *cur ) )
      {
        if ( *cur == '%' )
          /* According to the PLRM, a comment is equal to a space. */
          skip_comment( &cur, limit );
        else
          break;
      }
      cur++;
    }

    *acur = cur;
  }